

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O1

char * flatcc_json_parser_build_uint8_vector_base64
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *ref,
                 int urlsafe)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  flatcc_builder_ref_t fVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  char *buf_00;
  bool bVar16;
  uint8_t hold [4];
  byte local_54 [4];
  byte *local_50;
  int local_44;
  size_t local_40;
  byte *local_38;
  
  if ((buf == end) || (*buf != '\"')) {
    buf_00 = end;
    if (ctx->error == 0) {
      ctx->error = 0x10;
      ctx->pos = ((int)buf - *(int *)&ctx->line_start) + 1;
      ctx->error_loc = buf;
    }
  }
  else {
    buf_00 = buf + 1;
  }
  pcVar6 = flatcc_json_parser_string_part(ctx,buf_00,end);
  if ((pcVar6 != end) && (*pcVar6 == '\"')) {
    uVar9 = (long)pcVar6 - (long)buf_00;
    uVar3 = (uint)uVar9 & 3;
    local_40 = (uVar9 >> 2) * 3;
    if (uVar3 == 2) {
      local_40 = local_40 + 1;
    }
    else if (uVar3 == 3) {
      local_40 = local_40 + 2;
    }
    local_44 = urlsafe;
    iVar4 = flatcc_builder_start_vector(ctx->ctx,1,1,0xffffffff);
    if ((iVar4 == 0) &&
       (local_38 = (byte *)flatcc_builder_extend_vector(ctx->ctx,local_40), local_38 != (byte *)0x0)
       ) {
      puVar12 = base64_decode_base64url_decode;
      if (local_44 == 0) {
        puVar12 = base64_decode_base64rfc4648_decode;
      }
      uVar8 = -(ulong)(local_40 == 0) | local_40;
      uVar11 = uVar9;
      pcVar13 = buf_00;
      local_50 = local_38;
      do {
        uVar7 = 0;
        uVar10 = uVar11;
        do {
          uVar14 = uVar10 - uVar7;
          if (uVar14 == 0) {
            bVar16 = false;
            uVar14 = 0;
            switch(uVar7) {
            default:
              goto switchD_001172a4_caseD_0;
            case 1:
              goto switchD_001172a4_caseD_1;
            case 2:
              goto switchD_001172a4_caseD_2;
            case 3:
              goto switchD_001172a4_caseD_3;
            }
          }
          bVar1 = puVar12[(byte)pcVar13[uVar7]];
          local_54[uVar7] = bVar1;
          if (0x3f < bVar1) {
            if (bVar1 != 0x41) {
              uVar15 = uVar7;
              if (bVar1 == 0x42) goto LAB_00117268;
              bVar16 = false;
              switch(uVar7) {
              default:
                goto switchD_001172a4_caseD_0;
              case 1:
                goto switchD_001172a4_caseD_1;
              case 2:
                goto switchD_001172a4_caseD_2;
              case 3:
                goto switchD_001172a4_caseD_3;
              }
            }
            pcVar13 = pcVar13 + 1;
            uVar10 = uVar10 - 1;
            uVar7 = uVar7 - 1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < 4);
        bVar16 = uVar8 >= 3;
        if (uVar8 < 3) break;
        *local_50 = local_54[1] >> 4 | local_54[0] << 2;
        local_50[1] = local_54[2] >> 2 | local_54[1] << 4;
        local_50[2] = local_54[2] << 6 | local_54[3];
        local_50 = local_50 + 3;
        pcVar13 = pcVar13 + 4;
        uVar11 = uVar10 - 4;
        uVar8 = uVar8 - 3;
      } while (uVar8 != 0);
      goto switchD_001172a4_caseD_1;
    }
    goto LAB_0011712e;
  }
  goto LAB_00117346;
  while (lVar2 = uVar15 + 1, uVar15 = uVar14, (byte)(puVar12[(byte)pcVar13[lVar2]] + 0xbf) < 2) {
LAB_00117268:
    uVar14 = uVar15 + 1;
    if ((6 < uVar15) || (uVar10 <= uVar14)) break;
  }
  uVar14 = uVar10 - uVar14;
  bVar16 = false;
  switch(uVar7) {
  default:
switchD_001172a4_caseD_0:
    uVar11 = uVar14;
    bVar16 = true;
    break;
  case 1:
    break;
  case 2:
switchD_001172a4_caseD_2:
    if ((local_54[1] & 0xf) == 0) {
      *local_50 = local_54[1] >> 4 | local_54[0] << 2;
      local_50 = local_50 + 1;
      goto switchD_001172a4_caseD_0;
    }
    bVar16 = false;
    break;
  case 3:
switchD_001172a4_caseD_3:
    bVar16 = false;
    if (((local_54[2] & 3) == 0) && (uVar8 != 1)) {
      *local_50 = local_54[1] >> 4 | local_54[0] << 2;
      local_50[1] = local_54[2] >> 2 | local_54[1] << 4;
      local_50 = local_50 + 2;
      goto switchD_001172a4_caseD_0;
    }
  }
switchD_001172a4_caseD_1:
  if ((bVar16) && (uVar11 == 0)) {
    bVar16 = local_40 < (ulong)((long)local_50 - (long)local_38);
    local_40 = local_40 - ((long)local_50 - (long)local_38);
    if ((bVar16 || local_40 == 0) ||
       (iVar4 = flatcc_builder_truncate_vector(ctx->ctx,local_40), iVar4 == 0)) {
      fVar5 = flatcc_builder_end_vector(ctx->ctx);
      *ref = fVar5;
      if (fVar5 != 0) {
        if (*pcVar6 == '\"') {
          return pcVar6 + 1;
        }
        if (ctx->error != 0) {
          return end;
        }
        ctx->error = 0x14;
        goto LAB_00117364;
      }
    }
LAB_0011712e:
    *ref = 0;
    if (ctx->error != 0) {
      return end;
    }
    ctx->error = 0x23;
    goto LAB_00117364;
  }
  pcVar6 = buf_00 + (uVar9 - uVar11);
  urlsafe = local_44;
LAB_00117346:
  *ref = 0;
  if (ctx->error != 0) {
    return end;
  }
  ctx->error = 0x20 - (uint)(urlsafe == 0);
LAB_00117364:
  ctx->pos = ((int)pcVar6 - *(int *)&ctx->line_start) + 1;
  ctx->error_loc = pcVar6;
  return end;
}

Assistant:

const char *flatcc_json_parser_build_uint8_vector_base64(flatcc_json_parser_t *ctx,
        const char *buf, const char *end, flatcc_builder_ref_t *ref, int urlsafe)
{
    const char *mark;
    uint8_t *pval;
    size_t max_len;
    size_t decoded_len, src_len;
    int mode;
    int ret;

    mode = urlsafe ? base64_mode_url : base64_mode_rfc4648;
    buf = flatcc_json_parser_string_start(ctx, buf, end);
    buf = flatcc_json_parser_string_part(ctx, (mark = buf), end);
    if (buf == end || *buf != '\"') {
        goto base64_failed;
    }
    max_len = base64_decoded_size((size_t)(buf - mark));
    if (flatcc_builder_start_vector(ctx->ctx, 1, 1, FLATBUFFERS_COUNT_MAX((utype_size)))) {
        goto failed;
    }
    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, max_len))) {
        goto failed;
    }
    src_len = (size_t)(buf - mark);
    decoded_len = max_len;
    if ((ret = base64_decode(pval, (const uint8_t *)mark, &decoded_len, &src_len, mode))) {
        buf = mark + src_len;
        goto base64_failed;
    }
    if (src_len != (size_t)(buf - mark)) {
        buf = mark + src_len;
        goto base64_failed;
    }
    if (decoded_len < max_len) {
        if (flatcc_builder_truncate_vector(ctx->ctx, max_len - decoded_len)) {
            goto failed;
        }
    }
    if (!(*ref = flatcc_builder_end_vector(ctx->ctx))) {
        goto failed;
    }
    return flatcc_json_parser_string_end(ctx, buf, end);

failed:
    *ref = 0;
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);

base64_failed:
    *ref = 0;
    return flatcc_json_parser_set_error(ctx, buf, end,
            urlsafe ? flatcc_json_parser_error_base64url : flatcc_json_parser_error_base64);
}